

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O1

long uv__idna_toascii(char *s,char *se,char *d,char *de)

{
  char *se_00;
  uint uVar1;
  int iVar2;
  long lVar3;
  char *si;
  char *ds;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = d;
  local_40 = s;
  local_38 = d;
LAB_001667a4:
  while (se_00 = local_40, local_40 < se) {
    uVar1 = uv__utf8_decode1(&local_40,se);
    if ((int)uVar1 < 0x3002) goto LAB_001667d7;
    if (((uVar1 == 0x3002) || (uVar1 == 0xff61)) || (uVar1 == 0xff0e)) goto LAB_001667e1;
  }
  if ((s < se) && (iVar2 = uv__idna_toascii_label(s,se,&local_48,de), iVar2 < 0)) {
LAB_00166853:
    lVar3 = (long)iVar2;
  }
  else {
    if (local_48 < de) {
      *local_48 = '\0';
      local_48 = local_48 + 1;
    }
    lVar3 = (long)local_48 - (long)local_38;
  }
  return lVar3;
LAB_001667d7:
  if (uVar1 == 0xffffffff) {
    return -0x16;
  }
  if (uVar1 == 0x2e) {
LAB_001667e1:
    iVar2 = uv__idna_toascii_label(s,se_00,&local_48,de);
    if (iVar2 < 0) goto LAB_00166853;
    s = local_40;
    if (local_48 < de) {
      *local_48 = '.';
      local_48 = local_48 + 1;
    }
  }
  goto LAB_001667a4;
}

Assistant:

long uv__idna_toascii(const char* s, const char* se, char* d, char* de) {
  const char* si;
  const char* st;
  unsigned c;
  char* ds;
  int rc;

  ds = d;

  si = s;
  while (si < se) {
    st = si;
    c = uv__utf8_decode1(&si, se);

    if (c == -1u)
      return UV_EINVAL;

    if (c != '.')
      if (c != 0x3002)  /* 。 */
        if (c != 0xFF0E)  /* ． */
          if (c != 0xFF61)  /* ｡ */
            continue;

    rc = uv__idna_toascii_label(s, st, &d, de);

    if (rc < 0)
      return rc;

    if (d < de)
      *d++ = '.';

    s = si;
  }

  if (s < se) {
    rc = uv__idna_toascii_label(s, se, &d, de);

    if (rc < 0)
      return rc;
  }

  if (d < de)
    *d++ = '\0';

  return d - ds;  /* Number of bytes written. */
}